

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_utilities.hpp
# Opt level: O1

size_t jsoncons::jsonpath::escape_string<char,std::__cxx11::string>
                 (char *s,size_t length,
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *sink)

{
  char cVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  
  if (length == 0) {
    sVar3 = 0;
  }
  else {
    sVar4 = 0;
    sVar3 = 0;
    do {
      cVar1 = s[sVar4];
      lVar2 = 1;
      switch(cVar1) {
      case '\b':
        break;
      case '\t':
        break;
      case '\n':
        break;
      case '\v':
        goto switchD_003ba8af_caseD_b;
      case '\f':
        break;
      case '\r':
        break;
      default:
        if ((cVar1 == '\'') || (cVar1 == '\\')) break;
        goto switchD_003ba8af_caseD_b;
      }
      std::__cxx11::string::push_back((char)sink);
      lVar2 = 2;
switchD_003ba8af_caseD_b:
      sVar3 = sVar3 + lVar2;
      std::__cxx11::string::push_back((char)sink);
      sVar4 = sVar4 + 1;
    } while (length != sVar4);
  }
  return sVar3;
}

Assistant:

std::size_t escape_string(const CharT* s, std::size_t length, Sink& sink)
    {
        std::size_t count = 0;
        const CharT* begin = s;
        const CharT* end = s + length;
        for (const CharT* it = begin; it != end; ++it)
        {
            CharT c = *it;
            switch (c)
            {
                case '\\':
                    sink.push_back('\\');
                    sink.push_back('\\');
                    count += 2;
                    break;
                case '\'':
                    sink.push_back('\\');
                    sink.push_back('\'');
                    count += 2;
                    break;
                case '\b':
                    sink.push_back('\\');
                    sink.push_back('b');
                    count += 2;
                    break;
                case '\f':
                    sink.push_back('\\');
                    sink.push_back('f');
                    count += 2;
                    break;
                case '\n':
                    sink.push_back('\\');
                    sink.push_back('n');
                    count += 2;
                    break;
                case '\r':
                    sink.push_back('\\');
                    sink.push_back('r');
                    count += 2;
                    break;
                case '\t':
                    sink.push_back('\\');
                    sink.push_back('t');
                    count += 2;
                    break;
                default:
                    sink.push_back(c);
                    ++count;
                    break;
            }
        }
        return count;
    }